

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O2

bool ON__IsCylConeHelper(ON_Line *axis,ON_Curve *curve,double tolerance,ON_Plane *plane,
                        ON_Line *line,double *r,double *h)

{
  ON_3dVector *this;
  ON_Plane *this_00;
  double *pdVar1;
  bool bVar2;
  int iVar3;
  ON_3dVector *pOVar4;
  ON_3dVector *this_01;
  undefined4 uVar5;
  undefined4 uVar6;
  double dVar7;
  double a1;
  double a0;
  ON_3dPoint A0;
  ON_3dVector x0;
  ON_3dPoint A1;
  ON_3dVector x1;
  double local_d8;
  double local_d0;
  ON_Plane *local_c8;
  double *local_c0;
  double local_b8;
  ON_3dPoint local_b0;
  ON_3dVector local_98;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  local_b8 = tolerance;
  bVar2 = ON_Line::IsValid(axis);
  if (curve != (ON_Curve *)0x0 && bVar2) {
    local_c0 = r;
    ON_Curve::PointAtStart(&local_b0,curve);
    (line->from).z = local_b0.z;
    (line->from).x = local_b0.x;
    (line->from).y = local_b0.y;
    ON_Curve::PointAtEnd(&local_b0,curve);
    (line->to).z = local_b0.z;
    (line->to).x = local_b0.x;
    (line->to).y = local_b0.y;
    bVar2 = ON_Line::IsValid(line);
    if ((bVar2) && (dVar7 = ON_Line::Length(line), 2.3283064365386963e-10 < dVar7)) {
      ON_Line::Tangent((ON_3dVector *)&local_b0,axis);
      this_01 = &plane->zaxis;
      (plane->zaxis).z = local_b0.z;
      (plane->zaxis).x = local_b0.x;
      (plane->zaxis).y = local_b0.y;
      local_c8 = plane;
      ON_Line::Direction((ON_3dVector *)&local_b0,line);
      dVar7 = ON_3dVector::operator*(this_01,(ON_3dVector *)&local_b0);
      *h = dVar7;
      bVar2 = ON_IsValid(dVar7);
      if (bVar2) {
        dVar7 = *h;
        uVar5 = SUB84(dVar7,0);
        uVar6 = (undefined4)((ulong)dVar7 >> 0x20);
        if (dVar7 < 0.0) {
          ON_3dVector::operator-((ON_3dVector *)&local_b0,this_01);
          (plane->zaxis).z = local_b0.z;
          this_01->x = local_b0.x;
          (plane->zaxis).y = local_b0.y;
          dVar7 = -*h;
          uVar5 = SUB84(*h,0);
          uVar6 = (undefined4)((ulong)dVar7 >> 0x20);
          *h = dVar7;
        }
        if (2.3283064365386963e-10 < (double)CONCAT44(uVar6,uVar5)) {
          local_d0 = -1.23432101234321e+308;
          bVar2 = ON_Line::ClosestPointTo(axis,&line->from,&local_d0);
          if (bVar2) {
            local_d8 = -1.23432101234321e+308;
            bVar2 = ON_Line::ClosestPointTo(axis,&line->to,&local_d8);
            if (((bVar2) && (bVar2 = ON_IsValid(local_d0), bVar2)) &&
               (bVar2 = ON_IsValid(local_d8), bVar2)) {
              ON_Line::PointAt(&local_b0,axis,local_d0);
              ON_Line::PointAt(&local_60,axis,local_d8);
              this_00 = local_c8;
              (local_c8->origin).z = local_b0.z;
              (local_c8->origin).x = local_b0.x;
              (local_c8->origin).y = local_b0.y;
              ON_3dPoint::operator-(&local_98,&line->from,&local_b0);
              ON_3dPoint::operator-(&local_48,&line->to,&local_60);
              dVar7 = ON_3dVector::Length(&local_98);
              pdVar1 = local_c0;
              *local_c0 = dVar7;
              dVar7 = ON_3dVector::Length(&local_48);
              pdVar1[1] = dVar7;
              dVar7 = ON_3dVector::operator*(&local_98,&local_98);
              if (0.0 <= dVar7) {
                dVar7 = pdVar1[1];
              }
              else {
                dVar7 = pdVar1[1];
                if ((2.3283064365386963e-10 < *pdVar1) && (2.3283064365386963e-10 < dVar7)) {
                  return false;
                }
              }
              pOVar4 = &local_48;
              if (dVar7 <= *pdVar1) {
                pOVar4 = &local_98;
              }
              this = &this_00->xaxis;
              (this_00->xaxis).z = pOVar4->z;
              dVar7 = pOVar4->y;
              (this_00->xaxis).x = pOVar4->x;
              (this_00->xaxis).y = dVar7;
              dVar7 = ON_3dVector::Length(this);
              if ((2.3283064365386963e-10 < ABS(dVar7)) &&
                 (bVar2 = ON_3dVector::Unitize(this), bVar2)) {
                ON_CrossProduct(&local_78,this_01,this);
                (this_00->yaxis).z = local_78.z;
                (this_00->yaxis).x = local_78.x;
                (this_00->yaxis).y = local_78.y;
                bVar2 = ON_3dVector::Unitize(&this_00->yaxis);
                if (bVar2) {
                  ON_Plane::UpdateEquation(this_00);
                  bVar2 = ON_Plane::IsValid(this_00);
                  if (bVar2) {
                    ON_Line::Tangent(&local_78,line);
                    local_98.z = local_78.z;
                    local_98.x = local_78.x;
                    local_98.y = local_78.y;
                    dVar7 = ON_3dVector::operator*(&local_98,&this_00->yaxis);
                    if (ABS(dVar7) <= 2.3283064365386963e-10) {
                      iVar3 = (*(curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2e])
                                        (SUB84(local_b8,0),curve);
                      return (bool)(char)iVar3;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static
bool ON__IsCylConeHelper(
          const ON_Line& axis, 
          const ON_Curve* curve,
          double tolerance,
          ON_Plane& plane,
          ON_Line& line,
          double r[2],
          double& h
          )
{
  if ( !axis.IsValid() )
    return false;
  if ( !curve )
    return false;
  line.from = curve->PointAtStart();
  line.to   = curve->PointAtEnd();
  if ( !line.IsValid() )
    return false;
  if ( line.Length() <= ON_ZERO_TOLERANCE )
    return false;

  plane.zaxis = axis.Tangent();
  h = plane.zaxis*line.Direction();
  if ( !ON_IsValid(h) )
    return false;
  if ( h < 0.0 )
  {
    plane.zaxis = -plane.zaxis;
    h = -h;
  }
  if ( h <= ON_ZERO_TOLERANCE )
    return false;

  double a0 = ON_UNSET_VALUE;
  if ( !axis.ClosestPointTo(line.from,&a0) )
    return false;
  double a1 = ON_UNSET_VALUE;
  if ( !axis.ClosestPointTo(line.to,&a1) )
    return false;
  if ( !ON_IsValid(a0) || !ON_IsValid(a1) )
    return false;


  ON_3dPoint A0 = axis.PointAt(a0);
  ON_3dPoint A1 = axis.PointAt(a1);
  plane.origin = A0;
  ON_3dVector x0 = line.from - A0;
  ON_3dVector x1 = line.to   - A1;
  r[0] = x0.Length();
  r[1] = x1.Length();
  if ( x0*x0 < 0.0 && r[0] > ON_ZERO_TOLERANCE && r[1] > ON_ZERO_TOLERANCE )
    return false;
  plane.xaxis = ( r[0] >= r[1] ) ? x0 : x1;
  if (fabs(plane.xaxis.Length()) <= ON_ZERO_TOLERANCE)
    return false;
  if ( !plane.xaxis.Unitize() )
    return false;
  plane.yaxis = ON_CrossProduct(plane.zaxis,plane.xaxis);
  if ( !plane.yaxis.Unitize() )
    return false;
  plane.UpdateEquation();
  if ( !plane.IsValid() )
    return false;

  x0 = line.Tangent();
  if ( fabs(x0*plane.yaxis) > ON_ZERO_TOLERANCE )
    return false;

  return (curve->IsLinear( tolerance )?true:false);
}